

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::handleDefineDirective(Preprocessor *this,Token directive)

{
  SmallVector<slang::parsing::Token,_2UL> *this_00;
  size_t *psVar1;
  group_type_pointer pgVar2;
  TokenKind kind;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  BumpAllocator *pBVar7;
  DefineDirectiveSyntax *right;
  string_view rawText;
  bool bVar20;
  bool bVar21;
  undefined1 uVar22;
  NumericTokenFlags NVar23;
  uint32_t uVar24;
  undefined8 __n;
  value_type_pointer ppVar25;
  Preprocessor *__n_00;
  bool bVar26;
  SyntaxKind SVar27;
  int iVar28;
  uint uVar29;
  size_t sVar30;
  SourceLocation SVar31;
  undefined4 extraout_var;
  uint64_t uVar32;
  ulong uVar33;
  Diagnostic *this_01;
  __extent_storage<18446744073709551615UL> _Var34;
  Info *extraout_RDX;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *extraout_RDX_03;
  Info *extraout_RDX_04;
  Info *extraout_RDX_05;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  Token *pTVar39;
  Trivia *trivia;
  Trivia *this_02;
  undefined4 uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  string_view rawText_00;
  Token TVar59;
  string_view sVar60;
  Token TVar61;
  Token TVar62;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar63;
  Token TVar64;
  Token TVar65;
  Token TVar66;
  SourceRange SVar67;
  string_view directive_00;
  size_t pos;
  Token t;
  value_type *elements_1;
  MacroParser parser;
  value_type *elements;
  MacroFormalArgumentListSyntax *formalArguments;
  try_emplace_args_t local_139;
  pointer local_138;
  ulong local_130;
  Token local_128;
  Token local_118;
  group_type_pointer local_108;
  value_type_pointer local_100;
  MacroParser local_f8;
  ulong local_d8;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_d0;
  ulong local_c8;
  group_type_pointer local_c0;
  value_type_pointer local_b8;
  DefineDirectiveSyntax *local_b0;
  undefined8 local_a8;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  uchar uStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  uchar uStack_99;
  MacroFormalArgumentListSyntax *local_98;
  size_t local_90;
  size_t local_88;
  char *pcStack_80;
  Token local_78;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  uchar uStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  uchar uStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  uchar uStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  uchar uStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  Trivia local_40;
  Info *extraout_RDX_00;
  Info *pIVar35;
  
  local_78.info = directive.info;
  local_78._0_8_ = directive._0_8_;
  local_98 = (MacroFormalArgumentListSyntax *)0x0;
  Token::Token(&local_118);
  pTVar39 = &this->currentToken;
  if ((this->currentToken).info == (Info *)0x0) {
    TVar59 = nextProcessed(this);
    kind = TVar59.kind;
    this->currentToken = TVar59;
  }
  else {
    kind = pTVar39->kind;
  }
  bVar26 = LexerFacts::isKeyword(kind);
  if (bVar26) {
    pIVar35 = (this->currentToken).info;
    if (pIVar35 == (Info *)0x0) {
      TVar59 = nextProcessed(this);
      this->currentToken = TVar59;
    }
    else {
      uVar3 = pTVar39->kind;
      uVar8 = pTVar39->field_0x2;
      uVar12 = pTVar39->numFlags;
      uVar16 = pTVar39->rawLen;
      TVar59.rawLen = uVar16;
      TVar59.numFlags.raw = uVar12;
      TVar59._2_1_ = uVar8;
      TVar59.kind = uVar3;
      TVar59.info = pIVar35;
    }
    uVar22 = pTVar39->field_0x2;
    NVar23.raw = (pTVar39->numFlags).raw;
    uVar24 = pTVar39->rawLen;
    pIVar35 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar39->kind;
    (this->lastConsumed).field_0x2 = uVar22;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar23.raw;
    (this->lastConsumed).rawLen = uVar24;
    (this->lastConsumed).info = pIVar35;
    Token::Token((Token *)&local_f8);
    *(Preprocessor **)pTVar39 = local_f8.pp;
    (this->currentToken).info = (Info *)local_f8.buffer._M_ptr;
    _Var34._M_extent_value = (size_t)extraout_RDX;
  }
  else {
    TVar59 = expect(this,Identifier);
    _Var34._M_extent_value = (size_t)TVar59.info;
  }
  this->inMacroBody = true;
  uVar40 = (undefined4)CONCAT71(TVar59.info._1_7_,1);
  local_118 = TVar59;
  if ((TVar59._0_4_ >> 0x10 & 1) == 0) {
    sVar60 = Token::valueText(&local_118);
    bVar26 = (this->lexerOptions).enableLegacyProtect;
    directive_00._M_str._0_1_ = bVar26;
    directive_00._M_len = (size_t)sVar60._M_str;
    directive_00._M_str._1_7_ = 0;
    SVar27 = LexerFacts::getDirectiveKind((LexerFacts *)sVar60._M_len,directive_00,bVar26);
    if (SVar27 == MacroUsage) {
      uVar40 = 0;
      pIVar35 = extraout_RDX_00;
    }
    else {
      SVar67 = Token::range(&local_118);
      Diagnostics::add(this->diagnostics,(DiagCode)0xd0004,SVar67);
      uVar40 = (undefined4)CONCAT71(TVar59.info._1_7_,1);
      pIVar35 = extraout_RDX_01;
    }
    if ((this->currentToken).info == (Info *)0x0) {
      TVar61 = nextProcessed(this);
      this->currentToken = TVar61;
    }
    else {
      TVar61._2_6_ = 0;
      TVar61.kind = pTVar39->kind;
      TVar61.info = pIVar35;
    }
    _Var34._M_extent_value = (size_t)TVar61.info;
    if (TVar61.kind == OpenParenthesis) {
      sVar60 = Token::rawText(&local_118);
      if (sVar60._M_len == 0) {
        bVar26 = false;
      }
      else {
        sVar60 = Token::rawText(&local_118);
        bVar26 = *sVar60._M_str == '\\';
      }
      pIVar35 = (this->currentToken).info;
      if (pIVar35 == (Info *)0x0) {
        TVar62 = nextProcessed(this);
        this->currentToken = TVar62;
      }
      else {
        uVar4 = pTVar39->kind;
        uVar9 = pTVar39->field_0x2;
        uVar13 = pTVar39->numFlags;
        uVar17 = pTVar39->rawLen;
        TVar62.rawLen = uVar17;
        TVar62.numFlags.raw = uVar13;
        TVar62._2_1_ = uVar9;
        TVar62.kind = uVar4;
        TVar62.info = pIVar35;
      }
      local_f8.pp = TVar62._0_8_;
      local_f8.buffer._M_ptr = (pointer)TVar62.info;
      sVar63 = Token::trivia((Token *)&local_f8);
      _Var34 = sVar63._M_extent._M_extent_value;
      if ((Info *)_Var34._M_extent_value != (Info *)0x0) {
        if (!bVar26 || (Info *)_Var34._M_extent_value != (Info *)0x1) goto LAB_002044de;
        sVar60 = Trivia::getRawText(sVar63._M_ptr);
        _Var34._M_extent_value = (size_t)sVar60._M_str;
        if ((sVar60._M_len != 1) || (*(char *)&((Info *)_Var34._M_extent_value)->rawTextPtr != ' '))
        goto LAB_002044de;
      }
      local_f8.buffer._M_ptr = (pointer)0x0;
      local_f8.buffer._M_extent._M_extent_value = 0;
      local_f8.currentIndex = 0;
      local_f8.pp = this;
      local_98 = MacroParser::parseFormalArgumentList(&local_f8);
      _Var34._M_extent_value = (size_t)extraout_RDX_02;
    }
  }
LAB_002044de:
  local_100 = (value_type_pointer)CONCAT44(local_100._4_4_,uVar40);
  this_00 = &this->scratchTokenBuffer;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  local_138 = &this->lastConsumed;
  bVar26 = false;
  local_a8 = pTVar39;
  while( true ) {
    while( true ) {
      pIVar35 = (this->currentToken).info;
      if (pIVar35 == (Info *)0x0) {
        TVar64 = nextProcessed(this);
        pIVar35 = TVar64.info;
        this->currentToken = TVar64;
      }
      else {
        uVar5 = pTVar39->kind;
        uVar10 = pTVar39->field_0x2;
        uVar14 = pTVar39->numFlags;
        uVar18 = pTVar39->rawLen;
        TVar64.rawLen = uVar18;
        TVar64.numFlags.raw = uVar14;
        TVar64._2_1_ = uVar10;
        TVar64.kind = uVar5;
        TVar64.info = (Info *)_Var34._M_extent_value;
      }
      _Var34._M_extent_value = (size_t)TVar64.info;
      sVar30 = TVar64._0_8_;
      TVar65.info = pIVar35;
      TVar65.kind = (short)sVar30;
      TVar65._2_1_ = (char)(sVar30 >> 0x10);
      TVar65.numFlags.raw = (char)(sVar30 >> 0x18);
      TVar65.rawLen = (int)(sVar30 >> 0x20);
      local_128.info = pIVar35;
      local_128.kind = (short)sVar30;
      local_128._2_1_ = (char)(sVar30 >> 0x10);
      local_128.numFlags.raw = (char)(sVar30 >> 0x18);
      local_128.rawLen = (int)(sVar30 >> 0x20);
      uVar29 = TVar64._0_4_ & 0xffff;
      if (uVar29 != 0x15f) break;
      if (pIVar35 == (Info *)0x0) {
        TVar65 = nextProcessed(this);
        this->currentToken = TVar65;
      }
      uVar22 = pTVar39->field_0x2;
      NVar23.raw = (pTVar39->numFlags).raw;
      uVar24 = pTVar39->rawLen;
      pIVar35 = pTVar39->info;
      local_138->kind = pTVar39->kind;
      local_138->field_0x2 = uVar22;
      local_138->numFlags = (NumericTokenFlags)NVar23.raw;
      local_138->rawLen = uVar24;
      local_138->info = pIVar35;
      Token::Token((Token *)&local_f8);
      *(Preprocessor **)pTVar39 = local_f8.pp;
      pTVar39->info = (Info *)local_f8.buffer._M_ptr;
      local_f8.pp = TVar65._0_8_;
      local_f8.buffer._M_ptr = (pointer)TVar65.info;
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,(Token *)&local_f8);
      bVar26 = false;
      _Var34._M_extent_value = (size_t)extraout_RDX_03;
    }
    if (uVar29 == 1) break;
    sVar63 = Token::trivia(&local_128);
    if (sVar63._M_extent._M_extent_value._M_extent_value != 0) {
      lVar36 = sVar63._M_extent._M_extent_value._M_extent_value * 0x10;
      bVar21 = false;
      bVar20 = false;
      do {
        lVar36 = lVar36 + -0x10;
        _Var34 = sVar63._M_extent._M_extent_value;
        this_02 = sVar63._M_ptr;
        if (this_02->kind == LineComment) {
          sVar60 = Trivia::getRawText(this_02);
          _Var34._M_extent_value = (size_t)sVar60._M_str;
          bVar26 = *(EVP_PKEY_CTX *)(_Var34._M_extent_value + (sVar60._M_len - 1)) ==
                   (EVP_PKEY_CTX)0x5c;
        }
        else {
          if ((this_02->kind == EndOfLine) && (bVar20 = bVar21, !bVar26)) {
            bVar21 = true;
            bVar20 = true;
          }
          bVar26 = false;
        }
      } while ((!bVar20) &&
              (sVar63._M_extent._M_extent_value = _Var34._M_extent_value,
              sVar63._M_ptr = this_02 + 1, lVar36 != 0));
      pTVar39 = local_a8;
      if (bVar20) break;
    }
    if ((this->currentToken).info == (Info *)0x0) {
      TVar59 = nextProcessed(this);
      this->currentToken = TVar59;
    }
    uVar22 = pTVar39->field_0x2;
    NVar23.raw = (pTVar39->numFlags).raw;
    uVar24 = pTVar39->rawLen;
    pIVar35 = pTVar39->info;
    local_138->kind = pTVar39->kind;
    local_138->field_0x2 = uVar22;
    local_138->numFlags = (NumericTokenFlags)NVar23.raw;
    local_138->rawLen = uVar24;
    local_138->info = pIVar35;
    Token::Token((Token *)&local_f8);
    *(Preprocessor **)pTVar39 = local_f8.pp;
    pTVar39->info = (Info *)local_f8.buffer._M_ptr;
    if (local_128.kind == Identifier) {
      sVar60 = Token::rawText(&local_128);
      sVar30 = sVar60._M_len;
      if ((sVar30 == 0) || (sVar60._M_str[sVar30 - 1] != '\\')) goto LAB_002047c4;
      pIVar35 = (this->currentToken).info;
      if (pIVar35 == (Info *)0x0) {
        TVar66 = nextProcessed(this);
        this->currentToken = TVar66;
      }
      else {
        uVar6 = pTVar39->kind;
        uVar11 = pTVar39->field_0x2;
        uVar15 = pTVar39->numFlags;
        uVar19 = pTVar39->rawLen;
        TVar66.rawLen = uVar19;
        TVar66.numFlags.raw = uVar15;
        TVar66._2_1_ = uVar11;
        TVar66.kind = uVar6;
        TVar66.info = pIVar35;
      }
      local_f8.pp = TVar66._0_8_;
      local_f8.buffer._M_ptr = (pointer)TVar66.info;
      sVar63 = Token::trivia((Token *)&local_f8);
      if ((sVar63._M_extent._M_extent_value._M_extent_value == 0) ||
         ((sVar63._M_ptr)->kind != EndOfLine)) goto LAB_002047c4;
      rawText_00._M_len = sVar30 - 1;
      rawText_00._M_str = sVar60._M_str;
      TVar59 = Token::withRawText(&local_128,this->alloc,rawText_00);
      local_f8.pp = TVar59._0_8_;
      local_f8.buffer._M_ptr = (pointer)TVar59.info;
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,(Token *)&local_f8);
      pBVar7 = this->alloc;
      local_88 = 1;
      pcStack_80 = "\\";
      SVar31 = Token::location(&local_128);
      rawText._M_str = pcStack_80;
      rawText._M_len = local_88;
      Token::Token((Token *)&local_f8,pBVar7,LineContinuation,
                   (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),rawText,
                   (SourceLocation)
                   ((long)(((ulong)(uint)((int)((ulong)SVar31 >> 0x1c) + (int)sVar60._M_len) << 0x20
                           ) + -0x100000000) >> 4 | (ulong)(SVar31._0_4_ & 0xfffffff)));
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,(Token *)&local_f8);
      bVar26 = true;
      _Var34._M_extent_value = (size_t)extraout_RDX_04;
    }
    else {
LAB_002047c4:
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,&local_128);
      _Var34._M_extent_value = (size_t)extraout_RDX_05;
    }
  }
  this->inMacroBody = false;
  pBVar7 = this->alloc;
  iVar28 = SmallVectorBase<slang::parsing::Token>::copy
                     (&this_00->super_SmallVectorBase<slang::parsing::Token>,(EVP_PKEY_CTX *)pBVar7,
                      (EVP_PKEY_CTX *)_Var34._M_extent_value);
  local_f8.pp = (Preprocessor *)CONCAT44(extraout_var,iVar28);
  local_b0 = BumpAllocator::
             emplace<slang::syntax::DefineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::MacroFormalArgumentListSyntax*&,std::span<slang::parsing::Token,18446744073709551615ul>>
                       (pBVar7,&local_78,&local_118,&local_98,
                        (span<slang::parsing::Token,_18446744073709551615UL> *)&local_f8);
  sVar60 = Token::valueText(&local_118);
  local_f8.pp = (Preprocessor *)sVar60._M_len;
  local_f8.buffer._M_ptr = (pointer)sVar60._M_str;
  local_d0 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)&this->macros;
  uVar32 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &this->macros,(basic_string_view<char,_std::char_traits<char>_> *)&local_f8);
  __n_00 = local_f8.pp;
  uVar38 = uVar32 >> ((byte)(this->macros).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                            .arrays.groups_size_index & 0x3f);
  local_108 = (this->macros).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
              .arrays.groups_;
  lVar36 = (uVar32 & 0xff) * 4;
  uVar43 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           match_word(unsigned_long)::word[lVar36 + 0xc];
  uVar44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           match_word(unsigned_long)::word[lVar36 + 0xd];
  uVar45 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           match_word(unsigned_long)::word[lVar36 + 0xe];
  uVar46 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           match_word(unsigned_long)::word[lVar36 + 0xf];
  local_b8 = (this->macros).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
             .arrays.elements_;
  local_138 = local_f8.buffer._M_ptr;
  local_c8 = (ulong)((uint)uVar32 & 7);
  local_d8 = (this->macros).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
             .arrays.groups_size_mask;
  uVar37 = 0;
  uVar47 = uVar43;
  uVar48 = uVar44;
  uVar49 = uVar45;
  uVar50 = uVar46;
  uVar51 = uVar43;
  uVar52 = uVar44;
  uVar53 = uVar45;
  uVar54 = uVar46;
  uVar55 = uVar43;
  uVar56 = uVar44;
  uVar57 = uVar45;
  uVar58 = uVar46;
  do {
    ppVar25 = local_b8;
    pgVar2 = local_108 + uVar38;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    uStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    uStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    uStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    uStack_49 = pgVar2->m[0xf].n;
    auVar41[0] = -(local_58 == uVar43);
    auVar41[1] = -(uStack_57 == uVar44);
    auVar41[2] = -(uStack_56 == uVar45);
    auVar41[3] = -(uStack_55 == uVar46);
    auVar41[4] = -(uStack_54 == uVar47);
    auVar41[5] = -(uStack_53 == uVar48);
    auVar41[6] = -(uStack_52 == uVar49);
    auVar41[7] = -(uStack_51 == uVar50);
    auVar41[8] = -(uStack_50 == uVar51);
    auVar41[9] = -(uStack_4f == uVar52);
    auVar41[10] = -(uStack_4e == uVar53);
    auVar41[0xb] = -(uStack_4d == uVar54);
    auVar41[0xc] = -(uStack_4c == uVar55);
    auVar41[0xd] = -(uStack_4b == uVar56);
    auVar41[0xe] = -(uStack_4a == uVar57);
    auVar41[0xf] = -(uStack_49 == uVar58);
    local_c0 = (group_type_pointer)CONCAT71(local_c0._1_7_,uStack_49);
    uVar29 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
    local_130 = uVar38;
    if (uVar29 != 0) {
      local_a8._0_2_ = CONCAT11(uVar44,uVar43);
      local_a8._0_3_ = CONCAT12(uVar45,(undefined2)local_a8);
      local_a8._0_4_ = CONCAT13(uVar46,(undefined3)local_a8);
      local_a8._0_5_ = CONCAT14(uVar47,(undefined4)local_a8);
      local_a8._0_6_ = CONCAT15(uVar48,(undefined5)local_a8);
      local_a8._0_7_ = CONCAT16(uVar49,(undefined6)local_a8);
      local_a8 = (Token *)CONCAT17(uVar50,(undefined7)local_a8);
      uStack_a0 = uVar51;
      uStack_9f = uVar52;
      uStack_9e = uVar53;
      uStack_9d = uVar54;
      uStack_9c = uVar55;
      uStack_9b = uVar56;
      uStack_9a = uVar57;
      uStack_99 = uVar58;
      do {
        iVar28 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
          }
        }
        uVar33 = (ulong)(uint)(iVar28 << 5);
        if (__n_00 == *(Preprocessor **)((long)&ppVar25[uVar38 * 0xf].first._M_len + uVar33)) {
          if (__n_00 != (Preprocessor *)0x0) {
            iVar28 = bcmp(local_138,*(void **)((long)&ppVar25[uVar38 * 0xf].first._M_str + uVar33),
                          (size_t)__n_00);
            uVar43 = (uchar)local_a8;
            uVar44 = local_a8._1_1_;
            uVar45 = local_a8._2_1_;
            uVar46 = local_a8._3_1_;
            uVar47 = local_a8._4_1_;
            uVar48 = local_a8._5_1_;
            uVar49 = local_a8._6_1_;
            uVar50 = local_a8._7_1_;
            uVar51 = uStack_a0;
            uVar52 = uStack_9f;
            uVar53 = uStack_9e;
            uVar54 = uStack_9d;
            uVar55 = uStack_9c;
            uVar56 = uStack_9b;
            uVar57 = uStack_9a;
            uVar58 = uStack_99;
            if (iVar28 != 0) goto LAB_00204950;
          }
          if ((&ppVar25[uVar38 * 0xf].second.builtIn)[uVar33] == true) {
            SVar67 = Token::range(&local_118);
            Diagnostics::add(this->diagnostics,(DiagCode)0xd0004,SVar67);
            goto LAB_00204bd2;
          }
          if (((&ppVar25[uVar38 * 0xf].second.commandLine)[uVar33] != false) ||
             ((char)local_100 != '\0')) goto LAB_00204bd2;
          right = *(DefineDirectiveSyntax **)((long)&ppVar25[uVar38 * 0xf].second.syntax + uVar33);
          if (((right != (DefineDirectiveSyntax *)0x0) ||
              (*(int *)((long)&ppVar25[uVar38 * 0xf].second.intrinsic + uVar33) != 0)) &&
             (bVar26 = isSameMacro(local_b0,right), !bVar26)) {
            SVar67 = Token::range(&local_118);
            this_01 = Diagnostics::add(this->diagnostics,(DiagCode)0x290004,SVar67);
            sVar60 = Token::valueText(&local_118);
            Diagnostic::operator<<(this_01,sVar60);
            SVar31 = Token::location((Token *)(*(long *)((long)&ppVar25[uVar38 * 0xf].second.syntax
                                                        + uVar33) + 0x28));
            Diagnostic::addNote(this_01,(DiagCode)0xa0001,SVar31);
          }
          goto LAB_002049ab;
        }
LAB_00204950:
        uVar29 = uVar29 - 1 & uVar29;
      } while (uVar29 != 0);
    }
    if ((*(byte *)((long)&boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::
                          is_not_overflowed(unsigned_long)::shift + local_c8) & (byte)local_c0) == 0
       ) break;
    lVar36 = local_130 + uVar37;
    uVar37 = uVar37 + 1;
    uVar38 = lVar36 + 1U & local_d8;
  } while (uVar37 <= local_d8);
  if ((char)local_100 == '\0') {
LAB_002049ab:
    local_128 = (Token)Token::valueText(&local_118);
    local_108 = (group_type_pointer)
                hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                          (local_d0,(basic_string_view<char,_std::char_traits<char>_> *)&local_128);
    uVar37 = (ulong)local_108 >>
             ((byte)(this->macros).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                    .arrays.groups_size_index & 0x3f);
    local_c0 = (this->macros).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
               .arrays.groups_;
    lVar36 = ((ulong)local_108 & 0xff) * 4;
    uVar43 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar36 + 0xc];
    uVar44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar36 + 0xd];
    uVar45 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar36 + 0xe];
    uVar46 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar36 + 0xf];
    local_100 = (this->macros).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                .arrays.elements_;
    __n = local_128._0_8_;
    local_138 = (pointer)local_128.info;
    local_c8 = (ulong)((uint)local_108 & 7);
    local_90 = (this->macros).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
               .arrays.groups_size_mask;
    uVar38 = 0;
    uVar47 = uVar43;
    uVar48 = uVar44;
    uVar49 = uVar45;
    uVar50 = uVar46;
    uVar51 = uVar43;
    uVar52 = uVar44;
    uVar53 = uVar45;
    uVar54 = uVar46;
    uVar55 = uVar43;
    uVar56 = uVar44;
    uVar57 = uVar45;
    uVar58 = uVar46;
    local_d8 = uVar37;
    do {
      ppVar25 = local_100;
      pgVar2 = local_c0 + uVar37;
      local_68 = pgVar2->m[0].n;
      uStack_67 = pgVar2->m[1].n;
      uStack_66 = pgVar2->m[2].n;
      uStack_65 = pgVar2->m[3].n;
      uStack_64 = pgVar2->m[4].n;
      uStack_63 = pgVar2->m[5].n;
      uStack_62 = pgVar2->m[6].n;
      uStack_61 = pgVar2->m[7].n;
      uStack_60 = pgVar2->m[8].n;
      uStack_5f = pgVar2->m[9].n;
      uStack_5e = pgVar2->m[10].n;
      uStack_5d = pgVar2->m[0xb].n;
      uStack_5c = pgVar2->m[0xc].n;
      uStack_5b = pgVar2->m[0xd].n;
      uStack_5a = pgVar2->m[0xe].n;
      uStack_59 = pgVar2->m[0xf].n;
      auVar42[0] = -(local_68 == uVar43);
      auVar42[1] = -(uStack_67 == uVar44);
      auVar42[2] = -(uStack_66 == uVar45);
      auVar42[3] = -(uStack_65 == uVar46);
      auVar42[4] = -(uStack_64 == uVar47);
      auVar42[5] = -(uStack_63 == uVar48);
      auVar42[6] = -(uStack_62 == uVar49);
      auVar42[7] = -(uStack_61 == uVar50);
      auVar42[8] = -(uStack_60 == uVar51);
      auVar42[9] = -(uStack_5f == uVar52);
      auVar42[10] = -(uStack_5e == uVar53);
      auVar42[0xb] = -(uStack_5d == uVar54);
      auVar42[0xc] = -(uStack_5c == uVar55);
      auVar42[0xd] = -(uStack_5b == uVar56);
      auVar42[0xe] = -(uStack_5a == uVar57);
      auVar42[0xf] = -(uStack_59 == uVar58);
      local_b8 = (value_type_pointer)CONCAT71(local_b8._1_7_,uStack_59);
      uVar29 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
      local_130 = uVar37;
      if (uVar29 != 0) {
        local_a8._0_2_ = CONCAT11(uVar44,uVar43);
        local_a8._0_3_ = CONCAT12(uVar45,(undefined2)local_a8);
        local_a8._0_4_ = CONCAT13(uVar46,(undefined3)local_a8);
        local_a8._0_5_ = CONCAT14(uVar47,(undefined4)local_a8);
        local_a8._0_6_ = CONCAT15(uVar48,(undefined5)local_a8);
        local_a8._0_7_ = CONCAT16(uVar49,(undefined6)local_a8);
        local_a8 = (Token *)CONCAT17(uVar50,(undefined7)local_a8);
        uStack_a0 = uVar51;
        uStack_9f = uVar52;
        uStack_9e = uVar53;
        uStack_9d = uVar54;
        uStack_9c = uVar55;
        uStack_9b = uVar56;
        uStack_9a = uVar57;
        uStack_99 = uVar58;
        do {
          iVar28 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
            }
          }
          uVar33 = (ulong)(uint)(iVar28 << 5);
          if (__n == *(size_t *)((long)&ppVar25[uVar37 * 0xf].first._M_len + uVar33)) {
            _Var34._M_extent_value = (long)&ppVar25[uVar37 * 0xf].first._M_len + uVar33;
            if (__n == 0) goto LAB_00204b7f;
            iVar28 = bcmp(local_138,*(void **)((long)&ppVar25[uVar37 * 0xf].first._M_str + uVar33),
                          __n);
            uVar43 = (uchar)local_a8;
            uVar44 = local_a8._1_1_;
            uVar45 = local_a8._2_1_;
            uVar46 = local_a8._3_1_;
            uVar47 = local_a8._4_1_;
            uVar48 = local_a8._5_1_;
            uVar49 = local_a8._6_1_;
            uVar50 = local_a8._7_1_;
            uVar51 = uStack_a0;
            uVar52 = uStack_9f;
            uVar53 = uStack_9e;
            uVar54 = uStack_9d;
            uVar55 = uStack_9c;
            uVar56 = uStack_9b;
            uVar57 = uStack_9a;
            uVar58 = uStack_99;
            if (iVar28 == 0) goto LAB_00204b7f;
          }
          uVar29 = uVar29 - 1 & uVar29;
        } while (uVar29 != 0);
      }
      if ((*(byte *)((long)&boost::unordered::detail::foa::
                            group15<boost::unordered::detail::foa::plain_integral>::
                            is_not_overflowed(unsigned_long)::shift + local_c8) & (byte)local_b8) ==
          0) break;
      lVar36 = local_130 + uVar38;
      uVar38 = uVar38 + 1;
      uVar37 = lVar36 + 1U & local_90;
    } while (uVar38 <= local_90);
    if ((this->macros).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
        .size_ctrl.size <
        (this->macros).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)&local_f8,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                  *)local_d0,(arrays_type *)local_d0,local_d8,(size_t)local_108,&local_139,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_128);
      psVar1 = &(this->macros).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      _Var34._M_extent_value = local_f8.buffer._M_extent._M_extent_value;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)&local_f8,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                  *)local_d0,(size_t)local_108,&local_139,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_128);
      _Var34._M_extent_value = local_f8.buffer._M_extent._M_extent_value;
    }
LAB_00204b7f:
    *(DefineDirectiveSyntax **)(_Var34._M_extent_value + 0x10) = local_b0;
    *(undefined4 *)(_Var34._M_extent_value + 0x18) = 0;
    *(undefined2 *)(_Var34._M_extent_value + 0x1c) = 0;
  }
LAB_00204bd2:
  Trivia::Trivia(&local_40,Directive,(SyntaxNode *)local_b0);
  return local_40;
}

Assistant:

Trivia Preprocessor::handleDefineDirective(Token directive) {
    MacroFormalArgumentListSyntax* formalArguments = nullptr;
    bool bad = false;

    // Next token should be the macro name. We allow the name to be
    // a keyword token for compatibility with other tools.
    Token name;
    if (LF::isKeyword(peek().kind))
        name = consume();
    else
        name = expect(TokenKind::Identifier);

    inMacroBody = true;
    if (name.isMissing())
        bad = true;
    else {
        if (LF::getDirectiveKind(name.valueText(), lexerOptions.enableLegacyProtect) !=
            SyntaxKind::MacroUsage) {
            addDiag(diag::InvalidMacroName, name.range());
            bad = true;
        }

        // Check if this is a function-like macro, which requires an opening paren with no
        // leading space unless the macro name is escaped, in which case we have to allow one space.
        if (peek(TokenKind::OpenParenthesis)) {
            bool isEscaped = !name.rawText().empty() && name.rawText()[0] == '\\';
            auto trivia = peek().trivia();
            if (trivia.empty() ||
                (isEscaped && trivia.size() == 1 && trivia[0].getRawText() == " "sv)) {
                MacroParser parser(*this);
                formalArguments = parser.parseFormalArgumentList();
            }
        }
    }

    // consume all remaining tokens as macro text
    scratchTokenBuffer.clear();
    bool hasContinuation = false;
    while (true) {
        // Figure out when to stop consuming macro text. This involves looking for new lines in the
        // trivia of each token as we grab it. If there's a new line without a preceeding line
        // continuation token we know the macro is finished.
        Token t = peek();
        if (t.kind == TokenKind::EndOfFile)
            break;
        if (t.kind == TokenKind::LineContinuation) {
            hasContinuation = false;
            scratchTokenBuffer.push_back(consume());
            continue;
        }

        bool done = false;
        auto triviaList = t.trivia();
        for (const Trivia& trivia : triviaList) {
            switch (trivia.kind) {
                case TriviaKind::EndOfLine:
                    if (hasContinuation)
                        hasContinuation = false;
                    else
                        done = true;
                    break;
                case TriviaKind::LineComment:
                    // A line comment can have a trailing line continuation.
                    hasContinuation = (trivia.getRawText().back() == '\\');
                    break;
                default:
                    hasContinuation = false;
                    break;
            }
            if (done)
                break;
        }
        if (done)
            break;

        consume();

        if (t.kind == TokenKind::Identifier) {
            // Escaped identifiers that end in a backslash act as a continuation.
            auto raw = t.rawText();
            if (!raw.empty() && raw.back() == '\\') {
                auto nextTrivia = peek().trivia();
                if (!nextTrivia.empty() && nextTrivia[0].kind == TriviaKind::EndOfLine) {
                    hasContinuation = true;
                    scratchTokenBuffer.push_back(
                        t.withRawText(alloc, raw.substr(0, raw.size() - 1)));
                    scratchTokenBuffer.push_back(Token(alloc, TokenKind::LineContinuation, {}, "\\",
                                                       t.location() + raw.size() - 1));
                    continue;
                }
            }
        }

        scratchTokenBuffer.push_back(t);
    }
    inMacroBody = false;

    auto result = alloc.emplace<DefineDirectiveSyntax>(directive, name, formalArguments,
                                                       scratchTokenBuffer.copy(alloc));

    if (auto it = macros.find(name.valueText()); it != macros.end()) {
        if (it->second.builtIn) {
            addDiag(diag::InvalidMacroName, name.range());
            bad = true;
        }
        else if (it->second.commandLine)
            bad = true; // not really bad, but commandLine args has precedence so we skip this
        else if (!bad && it->second.valid() && !isSameMacro(*result, *it->second.syntax)) {
            auto& diag = addDiag(diag::RedefiningMacro, name.range());
            diag << name.valueText();
            diag.addNote(diag::NotePreviousDefinition, it->second.syntax->name.location());
        }
    }

    if (!bad)
        macros[name.valueText()] = result;
    return Trivia(TriviaKind::Directive, result);
}